

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t create_overflow_bucket
                    (int bucket_idx,ion_fpos_t *overflow_loc,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  ion_err_t iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uStack_50;
  undefined1 auStack_48 [8];
  int local_40 [2];
  linear_hash_bucket_t bucket;
  ulong uVar8;
  
  local_40[1] = 0;
  if (bucket_idx < linear_hash->bucket_map->current_size) {
    bucket._0_8_ = linear_hash->bucket_map->data[bucket_idx];
  }
  else {
    bucket._0_8_ = -1;
  }
  uStack_50 = 0x1039dd;
  local_40[0] = bucket_idx;
  iVar3 = fseek((FILE *)linear_hash->database,0,2);
  iVar2 = '\r';
  if (iVar3 == 0) {
    uStack_50 = 0x1039f2;
    lVar4 = ftell((FILE *)linear_hash->database);
    *overflow_loc = lVar4;
    uStack_50 = 0x103a04;
    iVar2 = array_list_insert(bucket_idx,lVar4,linear_hash->bucket_map);
    if (iVar2 == '\0') {
      uStack_50 = 0x103a1f;
      sVar5 = fwrite(local_40,0x10,1,(FILE *)linear_hash->database);
      iVar2 = '\a';
      if (sVar5 == 1) {
        lVar4 = -((long)(linear_hash->super).record.key_size +
                  (long)(linear_hash->super).record.value_size + 0x13U & 0xfffffffffffffff0);
        iVar3 = (linear_hash->super).record.key_size;
        iVar1 = (linear_hash->super).record.value_size;
        *(undefined8 *)(auStack_48 + lVar4 + -8) = 0x103a5e;
        memset(auStack_48 + lVar4,0,(long)iVar1 + (long)iVar3);
        *(undefined8 *)(auStack_48 + lVar4 + -8) = 0xffffffffffffffff;
        uVar8 = *(ulong *)(auStack_48 + lVar4 + -8);
        *(undefined8 *)(auStack_48 + lVar4 + -8) = 1;
        sVar5 = *(size_t *)(auStack_48 + lVar4 + -8);
        do {
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (linear_hash->records_per_bucket <= (int)uVar7) {
            return '\0';
          }
          iVar3 = (linear_hash->super).record.key_size;
          iVar1 = (linear_hash->super).record.value_size;
          __s = (FILE *)linear_hash->database;
          *(undefined8 *)(auStack_48 + lVar4 + -8) = 0x103a8e;
          sVar6 = fwrite(auStack_48 + lVar4,(long)iVar1 + (long)iVar3 + 4,sVar5,__s);
        } while (sVar6 == 1);
        iVar2 = '\a';
      }
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
create_overflow_bucket(
	int					bucket_idx,
	ion_fpos_t			*overflow_loc,
	linear_hash_table_t *linear_hash
) {
	ion_err_t err = err_uninitialized;

	/* initialize bucket fields */
	linear_hash_bucket_t bucket;

	bucket.idx					= bucket_idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= array_list_get(bucket_idx, linear_hash->bucket_map);

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	/* get overflow location for new overflow bucket */
	*overflow_loc	= ftell(linear_hash->database);

	err				= array_list_insert(bucket.idx, *overflow_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	/* write to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	return err_ok;
}